

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O0

Matrix3d * Util::OrthoNormMat(Matrix3d *mat)

{
  EigenBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>_> *in_RSI;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_RDI;
  Vector3d z_ort;
  Vector3d y_ort;
  Vector3d x_ort;
  double err;
  Vector3d z;
  Vector3d y;
  Vector3d x;
  Matrix3d *out;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffcdc;
  Index in_stack_fffffffffffffce0;
  Index in_stack_fffffffffffffce8;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffffcf0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffcf8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd40;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd48;
  
  this = in_RDI;
  Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::block<int,int>
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
             in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
  Eigen::Matrix<double,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this,in_RSI);
  Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::block<int,int>
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
             in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
  Eigen::Matrix<double,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this,in_RSI);
  Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::block<int,int>
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
             in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
  Eigen::Matrix<double,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this,in_RSI);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
            (this,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RSI);
  Eigen::operator*((double *)in_stack_fffffffffffffcf8,(StorageBaseType *)in_stack_fffffffffffffcf0)
  ;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),in_stack_fffffffffffffcd0
            );
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_RSI);
  Eigen::operator*((double *)in_stack_fffffffffffffcf8,(StorageBaseType *)in_stack_fffffffffffffcf0)
  ;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),in_stack_fffffffffffffcd0
            );
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_RSI);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RSI);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
            (in_stack_fffffffffffffcf8,(double *)in_stack_fffffffffffffcf0);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)this,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_RSI);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RSI);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
            (in_stack_fffffffffffffcf8,(double *)in_stack_fffffffffffffcf0);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)this,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_RSI);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RSI);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
            (in_stack_fffffffffffffcf8,(double *)in_stack_fffffffffffffcf0);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)this,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_RSI);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x12dc02);
  Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::block<int,int>
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
             in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)this,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RSI);
  Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::block<int,int>
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
             in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)this,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RSI);
  Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::block<int,int>
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
             in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)this,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RSI);
  return (Matrix3d *)in_RDI;
}

Assistant:

Eigen::Matrix3d OrthoNormMat(Eigen::Matrix3d mat){

		//extract columns
		Eigen::Vector3d x = mat.block(0,0,3,1);
		Eigen::Vector3d y = mat.block(0,1,3,1);
		Eigen::Vector3d z = mat.block(0,2,3,1);

		//error
		double err = x.dot(y);

		//orthogonal vectors
		Eigen::Vector3d x_ort = x - 0.5*err*y;
		Eigen::Vector3d y_ort = y - 0.5*err*z;
		Eigen::Vector3d z_ort = x_ort.cross(y_ort);

		//normalize
		x_ort = x_ort/x_ort.norm();
		y_ort = y_ort/y_ort.norm();
		z_ort = z_ort/z_ort.norm();

		//output
		Eigen::Matrix3d out;
		out.block(0,0,3,1) = x_ort;
		out.block(0,1,3,1) = y_ort;
		out.block(0,2,3,1) = z_ort;

		return out;
		// return mat;


	}